

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O3

int constructFixedHeader(BUFFER_HANDLE ctrlPacket,CONTROL_PACKET_TYPE packetType,uint8_t flags)

{
  bool bVar1;
  size_t sVar2;
  uint in_EAX;
  int iVar3;
  int iVar4;
  size_t sVar5;
  BUFFER_HANDLE handle;
  byte *pbVar6;
  size_t sVar7;
  uint8_t remainSize [4];
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  sVar5 = BUFFER_length(ctrlPacket);
  uStack_38 = (ulong)(uint)uStack_38;
  sVar2 = 0;
  do {
    sVar7 = sVar2;
    *(byte *)((long)&uStack_38 + sVar7 + 4) = (0x7f < sVar5) << 7 | (byte)sVar5 & 0x7f;
    bVar1 = 0x7f < sVar5;
    sVar5 = sVar5 >> 7;
    sVar2 = sVar7 + 1;
  } while (bVar1);
  handle = BUFFER_new();
  if (handle == (BUFFER_HANDLE)0x0) {
    iVar4 = 0x167;
  }
  else {
    iVar3 = BUFFER_pre_build(handle,sVar7 + 2);
    iVar4 = 0x16c;
    if (iVar3 == 0) {
      pbVar6 = BUFFER_u_char(handle);
      *pbVar6 = (byte)packetType | flags;
      memcpy(pbVar6 + 1,(void *)((long)&uStack_38 + 4),sVar7 + 1);
      iVar4 = BUFFER_prepend(ctrlPacket,handle);
    }
    BUFFER_delete(handle);
  }
  return iVar4;
}

Assistant:

static int constructFixedHeader(BUFFER_HANDLE ctrlPacket, CONTROL_PACKET_TYPE packetType, uint8_t flags)
{
    int result;
    size_t packetLen = BUFFER_length(ctrlPacket);
    uint8_t remainSize[4] ={ 0 };
    size_t index = 0;

    // Calculate the length of packet
    do
    {
        uint8_t encode = packetLen % 128;
        packetLen /= 128;
        // if there are more data to encode, set the top bit of this byte
        if (packetLen > 0)
        {
            encode |= NEXT_128_CHUNK;
        }
        remainSize[index++] = encode;
    } while (packetLen > 0);

    BUFFER_HANDLE fixedHeader = BUFFER_new();
    if (fixedHeader == NULL)
    {
        result = MU_FAILURE;
    }
    else if (BUFFER_pre_build(fixedHeader, index + 1) != 0)
    {
        BUFFER_delete(fixedHeader);
        result = MU_FAILURE;
    }
    else
    {
        uint8_t* iterator = BUFFER_u_char(fixedHeader);
        *iterator = (uint8_t)packetType | flags;
        iterator++;
        (void)memcpy(iterator, remainSize, index);

        result = BUFFER_prepend(ctrlPacket, fixedHeader);
        BUFFER_delete(fixedHeader);
    }
    return result;
}